

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorImpl<_54acdf1_> * __thiscall
llvm::SmallVectorImpl<$54acdf1$>::operator=
          (SmallVectorImpl<_54acdf1_> *this,SmallVectorImpl<_54acdf1_> *RHS)

{
  U *pUVar1;
  undefined1 *__ptr;
  undefined4 *puVar2;
  void *pvVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  ulong MinSize;
  undefined4 *puVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (this == RHS) {
    return this;
  }
  puVar9 = (undefined8 *)
           (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
           super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX;
  pUVar1 = &(RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
            super_SmallVectorTemplateCommon<_dd0a5239_>.FirstEl;
  if ((U *)puVar9 != pUVar1) {
    __ptr = (undefined1 *)
            (this->super_SmallVectorTemplateBase<_c3582d1e_>).
            super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX;
    if ((U *)__ptr !=
        &(this->super_SmallVectorTemplateBase<_c3582d1e_>).
         super_SmallVectorTemplateCommon<_dd0a5239_>.FirstEl) {
      free(__ptr);
      puVar9 = (undefined8 *)
               (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
               super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX;
    }
    (this->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
    super_SmallVectorBase.BeginX = puVar9;
    pvVar3 = (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
             super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.CapacityX;
    (this->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
    super_SmallVectorBase.EndX =
         (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
         super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.EndX;
    (this->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
    super_SmallVectorBase.CapacityX = pvVar3;
    (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
    super_SmallVectorBase.CapacityX = pUVar1;
    (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
    super_SmallVectorBase.EndX = pUVar1;
    (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
    super_SmallVectorBase.BeginX = pUVar1;
    return this;
  }
  puVar6 = (undefined8 *)
           (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
           super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.EndX;
  uVar12 = (long)puVar6 - (long)puVar9;
  MinSize = ((long)uVar12 >> 3) * -0x5555555555555555;
  puVar10 = (undefined4 *)
            (this->super_SmallVectorTemplateBase<_c3582d1e_>).
            super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX;
  puVar2 = (undefined4 *)
           (this->super_SmallVectorTemplateBase<_c3582d1e_>).
           super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.EndX;
  uVar5 = (long)puVar2 - (long)puVar10;
  uVar11 = ((long)uVar5 >> 3) * -0x5555555555555555;
  if (MinSize <= uVar11) {
    if (0 < (long)uVar12 && puVar6 != puVar9) {
      uVar5 = uVar12 / 0x18 + 1;
      puVar6 = puVar9;
      do {
        *puVar10 = *(undefined4 *)puVar6;
        *(undefined8 *)(puVar10 + 2) = puVar6[1];
        *(undefined8 *)(puVar10 + 4) = puVar6[2];
        puVar6 = puVar6 + 3;
        puVar10 = puVar10 + 6;
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
    goto LAB_00151010;
  }
  if ((ulong)((long)(this->super_SmallVectorTemplateBase<_c3582d1e_>).
                    super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.CapacityX -
             (long)puVar10) < uVar12) {
    (this->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
    super_SmallVectorBase.EndX = puVar10;
    SmallVectorTemplateBase<$c3582d1e$>::grow
              (&this->super_SmallVectorTemplateBase<_c3582d1e_>,MinSize);
    puVar9 = (undefined8 *)
             (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
             super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX;
    puVar6 = (undefined8 *)
             (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
             super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.EndX;
    puVar10 = (undefined4 *)
              (this->super_SmallVectorTemplateBase<_c3582d1e_>).
              super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX;
LAB_00150fd8:
    uVar11 = 0;
  }
  else {
    if (puVar2 == puVar10) goto LAB_00150fd8;
    if (0 < (long)uVar5) {
      uVar5 = uVar5 / 0x18 + 1;
      lVar7 = 0;
      do {
        *(undefined4 *)((long)puVar10 + lVar7) = *(undefined4 *)((long)puVar9 + lVar7);
        *(undefined8 *)((long)puVar10 + lVar7 + 8) = *(undefined8 *)((long)puVar9 + lVar7 + 8);
        *(undefined8 *)((long)puVar10 + lVar7 + 0x10) = *(undefined8 *)((long)puVar9 + lVar7 + 0x10)
        ;
        uVar5 = uVar5 - 1;
        lVar7 = lVar7 + 0x18;
      } while (1 < uVar5);
    }
  }
  puVar8 = puVar9 + uVar11 * 3;
  if (puVar8 != puVar6) {
    puVar9 = (undefined8 *)(puVar10 + uVar11 * 6);
    do {
      puVar9[2] = puVar8[2];
      uVar4 = puVar8[1];
      *puVar9 = *puVar8;
      puVar9[1] = uVar4;
      puVar8 = puVar8 + 3;
      puVar9 = puVar9 + 3;
    } while (puVar8 != puVar6);
    puVar10 = (undefined4 *)
              (this->super_SmallVectorTemplateBase<_c3582d1e_>).
              super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX;
    puVar9 = (undefined8 *)
             (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).
             super_SmallVectorTemplateCommon<_dd0a5239_>.super_SmallVectorBase.BeginX;
  }
  puVar10 = (undefined4 *)((long)puVar10 + uVar12);
LAB_00151010:
  (this->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
  super_SmallVectorBase.EndX = puVar10;
  (RHS->super_SmallVectorTemplateBase<_c3582d1e_>).super_SmallVectorTemplateCommon<_dd0a5239_>.
  super_SmallVectorBase.EndX = puVar9;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->EndX = RHS.EndX;
    this->CapacityX = RHS.CapacityX;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->setEnd(NewEnd);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);

  RHS.clear();
  return *this;
}